

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-transpose-array.h
# Opt level: O3

int transpose_array(coda_cursor *cursor,void *array,int element_size)

{
  long lVar1;
  int iVar2;
  long *plVar3;
  long lVar4;
  void *__src;
  int iVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  size_t __size;
  long lVar10;
  int num_dims;
  long rsub [9];
  long rdim [9];
  long multiplier [9];
  long dim [8];
  undefined8 uStack_170;
  long local_168 [9];
  long alStack_120 [9];
  long alStack_d8 [12];
  long local_78 [9];
  
  iVar2 = coda_cursor_get_array_dim(cursor,(int *)((long)&uStack_170 + 4),local_78);
  iVar5 = -1;
  if (iVar2 == 0) {
    lVar9 = (long)uStack_170._4_4_;
    if (1 < lVar9) {
      lVar10 = 0;
      memset(local_168,0,lVar9 * 8);
      plVar3 = local_78 + (uStack_170._4_4_ - 1);
      lVar8 = 1;
      do {
        lVar8 = lVar8 * local_78[lVar10];
        alStack_120[lVar10 + 1] = *plVar3;
        lVar10 = lVar10 + 1;
        plVar3 = plVar3 + -1;
      } while (lVar9 != lVar10);
      if (1 < lVar8) {
        lVar4 = 1;
        alStack_d8[lVar9 + 2] = 1;
        alStack_120[lVar9 + 1] = 1;
        lVar10 = lVar9 + 1;
        do {
          lVar4 = lVar4 * alStack_120[lVar10];
          alStack_d8[lVar10] = lVar4;
          lVar10 = lVar10 + -1;
        } while (1 < lVar10);
        alStack_120[lVar9 + 1] = 0;
        local_168[lVar9] = 0;
        __size = (ulong)(uint)element_size * lVar8;
        __src = malloc(__size);
        if (__src == (void *)0x0) {
          coda_set_error(-1,"out of memory (could not allocate %lu bytes) (%s:%u)",__size,
                         "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-transpose-array.h"
                         ,0x5d);
          return -1;
        }
        switch(element_size) {
        case 1:
          lVar9 = 0;
          lVar10 = 0;
          do {
            *(undefined1 *)((long)__src + lVar10) = *(undefined1 *)((long)array + lVar9);
            lVar10 = lVar10 + alStack_d8[2];
            local_168[0] = local_168[0] + 1;
            if (local_168[0] == alStack_120[1]) {
              lVar6 = 8;
              lVar4 = alStack_d8[2];
              lVar7 = alStack_120[1];
              do {
                lVar7 = lVar4 * lVar7;
                *(undefined8 *)((long)&uStack_170 + lVar6) = 0;
                lVar4 = *(long *)((long)alStack_d8 + lVar6 + 0x10);
                lVar10 = (lVar10 + lVar4) - lVar7;
                lVar7 = *(long *)((long)local_168 + lVar6) + 1;
                *(long *)((long)local_168 + lVar6) = lVar7;
                lVar1 = lVar6 + 8;
                lVar6 = lVar6 + 8;
              } while (lVar7 == *(long *)((long)alStack_120 + lVar1));
            }
            lVar9 = lVar9 + 1;
          } while (lVar9 != lVar8);
          break;
        case 2:
          lVar9 = 0;
          lVar10 = 0;
          do {
            *(undefined2 *)((long)__src + lVar10 * 2) = *(undefined2 *)((long)array + lVar9 * 2);
            lVar10 = lVar10 + alStack_d8[2];
            local_168[0] = local_168[0] + 1;
            if (local_168[0] == alStack_120[1]) {
              lVar6 = 8;
              lVar4 = alStack_d8[2];
              lVar7 = alStack_120[1];
              do {
                lVar7 = lVar4 * lVar7;
                *(undefined8 *)((long)&uStack_170 + lVar6) = 0;
                lVar4 = *(long *)((long)alStack_d8 + lVar6 + 0x10);
                lVar10 = (lVar10 + lVar4) - lVar7;
                lVar7 = *(long *)((long)local_168 + lVar6) + 1;
                *(long *)((long)local_168 + lVar6) = lVar7;
                lVar1 = lVar6 + 8;
                lVar6 = lVar6 + 8;
              } while (lVar7 == *(long *)((long)alStack_120 + lVar1));
            }
            lVar9 = lVar9 + 1;
          } while (lVar9 != lVar8);
          break;
        default:
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-transpose-array.h"
                        ,0xac,"int transpose_array(const coda_cursor *, void *, int)");
        case 4:
          lVar9 = 0;
          lVar10 = 0;
          do {
            *(undefined4 *)((long)__src + lVar10 * 4) = *(undefined4 *)((long)array + lVar9 * 4);
            lVar10 = lVar10 + alStack_d8[2];
            local_168[0] = local_168[0] + 1;
            if (local_168[0] == alStack_120[1]) {
              lVar6 = 8;
              lVar4 = alStack_d8[2];
              lVar7 = alStack_120[1];
              do {
                lVar7 = lVar4 * lVar7;
                *(undefined8 *)((long)&uStack_170 + lVar6) = 0;
                lVar4 = *(long *)((long)alStack_d8 + lVar6 + 0x10);
                lVar10 = (lVar10 + lVar4) - lVar7;
                lVar7 = *(long *)((long)local_168 + lVar6) + 1;
                *(long *)((long)local_168 + lVar6) = lVar7;
                lVar1 = lVar6 + 8;
                lVar6 = lVar6 + 8;
              } while (lVar7 == *(long *)((long)alStack_120 + lVar1));
            }
            lVar9 = lVar9 + 1;
          } while (lVar9 != lVar8);
          break;
        case 8:
          lVar9 = 0;
          lVar10 = 0;
          do {
            *(undefined8 *)((long)__src + lVar10 * 8) = *(undefined8 *)((long)array + lVar9 * 8);
            lVar10 = lVar10 + alStack_d8[2];
            local_168[0] = local_168[0] + 1;
            if (local_168[0] == alStack_120[1]) {
              lVar6 = 8;
              lVar4 = alStack_d8[2];
              lVar7 = alStack_120[1];
              do {
                lVar7 = lVar4 * lVar7;
                *(undefined8 *)((long)&uStack_170 + lVar6) = 0;
                lVar4 = *(long *)((long)alStack_d8 + lVar6 + 0x10);
                lVar10 = (lVar10 + lVar4) - lVar7;
                lVar7 = *(long *)((long)local_168 + lVar6) + 1;
                *(long *)((long)local_168 + lVar6) = lVar7;
                lVar1 = lVar6 + 8;
                lVar6 = lVar6 + 8;
              } while (lVar7 == *(long *)((long)alStack_120 + lVar1));
            }
            lVar9 = lVar9 + 1;
          } while (lVar9 != lVar8);
        }
        memcpy(array,__src,__size);
        free(__src);
      }
    }
    iVar5 = 0;
  }
  return iVar5;
}

Assistant:

static int transpose_array(const coda_cursor *cursor, void *array, int element_size)
{
    long dim[CODA_MAX_NUM_DIMS];
    int num_dims;
    long num_elements;
    long multiplier[CODA_MAX_NUM_DIMS + 1];
    long rsub[CODA_MAX_NUM_DIMS + 1];   /* reversed index in multi dim array */
    long rdim[CODA_MAX_NUM_DIMS + 1];   /* reversed order of dim[] */
    long index = 0;
    long i;
    uint8_t *src;
    uint8_t *dst;

    if (coda_cursor_get_array_dim(cursor, &num_dims, dim) != 0)
    {
        return -1;
    }

    if (num_dims <= 1)
    {
        /* nothing to do */
        return 0;
    }

    src = (uint8_t *)array;

    num_elements = 1;
    for (i = 0; i < num_dims; i++)
    {
        num_elements *= dim[i];
        rsub[i] = 0;
        rdim[i] = dim[num_dims - 1 - i];
    }
    if (num_elements <= 1)
    {
        /* nothing to do */
        return 0;
    }

    multiplier[num_dims] = 1;
    rdim[num_dims] = 1;
    for (i = num_dims; i > 0; i--)
    {
        multiplier[i - 1] = multiplier[i] * rdim[i];
    }
    rdim[num_dims] = 0;
    rsub[num_dims] = 0;

    dst = (uint8_t *)malloc(num_elements * element_size);
    if (dst == NULL)
    {
        coda_set_error(CODA_ERROR_OUT_OF_MEMORY, "out of memory (could not allocate %lu bytes) (%s:%u)",
                       num_elements * element_size, __FILE__, __LINE__);
        return -1;
    }

    switch (element_size)
    {
        case 1:
            for (i = 0; i < num_elements; i++)
            {
                int j = 0;

                dst[index] = src[i];
                index += multiplier[j];
                rsub[j]++;
                while (rsub[j] == rdim[j])
                {
                    rsub[j] = 0;
                    index -= multiplier[j] * rdim[j];
                    j++;
                    index += multiplier[j];
                    rsub[j]++;
                }
            }
            break;
        case 2:
            for (i = 0; i < num_elements; i++)
            {
                int j = 0;

                ((uint16_t *)dst)[index] = ((uint16_t *)src)[i];
                index += multiplier[j];
                rsub[j]++;
                while (rsub[j] == rdim[j])
                {
                    rsub[j] = 0;
                    index -= multiplier[j] * rdim[j];
                    j++;
                    index += multiplier[j];
                    rsub[j]++;
                }
            }
            break;
        case 4:
            for (i = 0; i < num_elements; i++)
            {
                int j = 0;

                ((uint32_t *)dst)[index] = ((uint32_t *)src)[i];
                index += multiplier[j];
                rsub[j]++;
                while (rsub[j] == rdim[j])
                {
                    rsub[j] = 0;
                    index -= multiplier[j] * rdim[j];
                    j++;
                    index += multiplier[j];
                    rsub[j]++;
                }
            }
            break;
        case 8:
            for (i = 0; i < num_elements; i++)
            {
                int j = 0;

                ((uint64_t *)dst)[index] = ((uint64_t *)src)[i];
                index += multiplier[j];
                rsub[j]++;
                while (rsub[j] == rdim[j])
                {
                    rsub[j] = 0;
                    index -= multiplier[j] * rdim[j];
                    j++;
                    index += multiplier[j];
                    rsub[j]++;
                }
            }
            break;
        default:
            assert(0);
            exit(1);
    }

    memcpy(array, dst, num_elements * element_size);

    free(dst);

    return 0;
}